

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

TypeArray *
soul::AST::CommaSeparatedList::getListOfResultTypes
          (TypeArray *__return_storage_ptr__,pool_ptr<soul::AST::Expression> *expressionOrList)

{
  size_t minSize;
  Expression *pEVar1;
  Type local_a8;
  pool_ref<soul::AST::Expression> *local_90;
  pool_ref<soul::AST::Expression> *i;
  pool_ref<soul::AST::Expression> *__end2;
  pool_ref<soul::AST::Expression> *__begin2;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *__range2;
  pool_ptr<soul::AST::Expression> local_60;
  undefined1 local_58 [8];
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> list;
  pool_ptr<soul::AST::Expression> *expressionOrList_local;
  TypeArray *types;
  
  list.space[3]._7_1_ = 0;
  ArrayWithPreallocation<soul::Type,_8UL>::ArrayWithPreallocation(__return_storage_ptr__);
  local_60 = (pool_ptr<soul::AST::Expression>)expressionOrList->object;
  getAsExpressionList((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)local_58
                      ,&local_60);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_60);
  minSize = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::size
                      ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                       local_58);
  ArrayWithPreallocation<soul::Type,_8UL>::reserve(__return_storage_ptr__,minSize);
  __begin2 = (pool_ref<soul::AST::Expression> *)local_58;
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::begin
                     ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)__begin2
                     );
  i = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::end
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)__begin2);
  for (; __end2 != i; __end2 = __end2 + 1) {
    local_90 = __end2;
    pEVar1 = pool_ref<soul::AST::Expression>::operator->(__end2);
    (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_a8);
    ArrayWithPreallocation<soul::Type,_8UL>::push_back(__return_storage_ptr__,&local_a8);
    Type::~Type(&local_a8);
  }
  list.space[3]._7_1_ = 1;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::~ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)local_58);
  if ((list.space[3]._7_1_ & 1) == 0) {
    ArrayWithPreallocation<soul::Type,_8UL>::~ArrayWithPreallocation(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static TypeArray getListOfResultTypes (pool_ptr<Expression> expressionOrList)
        {
            TypeArray types;
            auto list = getAsExpressionList (expressionOrList);
            types.reserve (list.size());

            for (auto& i : list)
                types.push_back (i->getResultType());

            return types;
        }